

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

void * __thiscall
chrono::ChClassFactory::_archive_in_create
          (ChClassFactory *this,string *keyName,ChArchiveIn *marchive)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  undefined4 extraout_var;
  ChException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_true>
  *local_28;
  iterator *it;
  ChArchiveIn *marchive_local;
  string *keyName_local;
  ChClassFactory *this_local;
  
  it = (iterator *)marchive;
  marchive_local = (ChArchiveIn *)keyName;
  keyName_local = (string *)this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>_>
               *)this,keyName);
  local_28 = &local_30;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>_>_>
              *)this);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (!bVar1) {
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    std::operator+(&local_78,"ChClassFactory::create() cannot find the class with name ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   marchive_local);
    std::operator+(&local_58,&local_78,". Please register it.\n");
    ChException::ChException(this_00,&local_58);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::ChClassRegistrationBase_*>,_false,_true>
                         *)local_28);
  iVar2 = (*ppVar3->second->_vptr_ChClassRegistrationBase[1])(ppVar3->second,it);
  return (void *)CONCAT44(extraout_var,iVar2);
}

Assistant:

void* _archive_in_create(const std::string& keyName, ChArchiveIn& marchive) {
        const auto &it = class_map.find(keyName);
        if (it != class_map.end()) {
            return it->second->create(marchive);
        }
        throw ( ChException("ChClassFactory::create() cannot find the class with name " + keyName + ". Please register it.\n") );
    }